

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.hpp
# Opt level: O2

State * __thiscall
Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::
update<KalmanExamples::Robot1::OrientationMeasurement<float>,Kalman::StandardBase>
          (UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *this,
          MeasurementModelType<KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
          *m,OrientationMeasurement<float> *z)

{
  UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>_> *this_00;
  float *cov;
  float *K_00;
  float *local_88;
  OrientationMeasurement<float> *local_80;
  UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>_> *local_78;
  undefined1 local_68 [8];
  SigmaPoints<KalmanExamples::Robot1::OrientationMeasurement<float>_> sigmaMeasurementPoints;
  KalmanGain<KalmanExamples::Robot1::OrientationMeasurement<float>_> K;
  OrientationMeasurement<float> y;
  Covariance<KalmanExamples::Robot1::OrientationMeasurement<float>_> P_yy;
  
  this_00 = (UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>_> *)
            (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
            1);
  UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>_>::
  computeMeasurementPrediction<KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
            (this_00,(MeasurementModelType<KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
                      *)this,
             (SigmaPoints<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)m);
  cov = K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 2;
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::
  computeCovarianceFromSigmaPoints<KalmanExamples::Robot1::OrientationMeasurement<float>_>
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this,
             (OrientationMeasurement<float> *)this_00,
             (SigmaPoints<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)local_68,
             &(m->super_StandardBase<KalmanExamples::Robot1::OrientationMeasurement<float>_>).P,
             (Covariance<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)cov);
  K_00 = sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_1,_7,_1,_1,_7>_>.
         m_storage.m_data.array + 5;
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::
  computeKalmanGain<KalmanExamples::Robot1::OrientationMeasurement<float>_>
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this,
             (OrientationMeasurement<float> *)this_00,
             (SigmaPoints<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)local_68,
             (Covariance<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)cov,
             (KalmanGain<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)K_00);
  local_88 = K_00;
  local_80 = z;
  local_78 = this_00;
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)this,
             (MatrixBase<Eigen::Product<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<float,_1,_1,_0,_1,_1>_>,_0>_>
              *)&local_88);
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::
  updateStateCovariance<KalmanExamples::Robot1::OrientationMeasurement<float>_>
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this,
             (KalmanGain<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)K_00,
             (Covariance<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)cov);
  return (State *)this;
}

Assistant:

const State& update( const MeasurementModelType<Measurement, CovarianceBase>& m, const Measurement& z )
        {
            SigmaPoints<Measurement> sigmaMeasurementPoints;
            
            // Predict measurement (and corresponding sigma points)
            Measurement y = this->template computeMeasurementPrediction<Measurement, CovarianceBase>(m, sigmaMeasurementPoints);
            
            // Compute innovation covariance
            Covariance<Measurement> P_yy;
            computeCovarianceFromSigmaPoints(y, sigmaMeasurementPoints, m.getCovariance(), P_yy);
            
            KalmanGain<Measurement> K;
            computeKalmanGain(y, sigmaMeasurementPoints, P_yy, K);
            
            // Update state
            x += K * ( z - y );
            
            // Update state covariance
            updateStateCovariance<Measurement>(K, P_yy);
            
            return this->getState();
        }